

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O3

void __thiscall
sglr::ReferenceContext::drawElementsInstancedBaseVertex
          (ReferenceContext *this,deUint32 mode,int count,deUint32 type,void *indices,
          int instanceCount,int baseVertex)

{
  DataBuffer *pDVar1;
  pointer puVar2;
  bool bVar3;
  PrimitiveType primitiveType;
  IndexType type_00;
  pointer puVar4;
  VertexArray *pVVar5;
  DrawIndices local_60;
  PrimitiveList local_50;
  
  pVVar5 = &this->m_clientVertexArray;
  if (this->m_vertexArrayBinding != (VertexArray *)0x0) {
    pVVar5 = this->m_vertexArrayBinding;
  }
  if ((type - 0x1401 < 5) && ((0x15U >> (type - 0x1401 & 0x1f) & 1) != 0)) {
    if ((instanceCount | count) < 0) {
      if (this->m_lastError == 0) {
        this->m_lastError = 0x501;
      }
    }
    else {
      bVar3 = predrawErrorChecks(this,mode);
      if (bVar3) {
        primitiveType = rr_util::mapGLPrimitiveType(mode);
        pDVar1 = pVVar5->m_elementArrayBufferBinding;
        if (pDVar1 != (DataBuffer *)0x0) {
          puVar2 = (pDVar1->m_data).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start;
          puVar4 = (pointer)0x0;
          if (puVar2 != (pDVar1->m_data).
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_finish) {
            puVar4 = puVar2;
          }
          indices = (void *)((long)indices + (long)puVar4);
        }
        type_00 = rr_util::mapGLIndexType(type);
        rr::DrawIndices::DrawIndices(&local_60,indices,type_00,baseVertex);
        rr::PrimitiveList::PrimitiveList(&local_50,primitiveType,count,&local_60);
        drawWithReference(this,&local_50,instanceCount);
      }
    }
  }
  else if (this->m_lastError == 0) {
    this->m_lastError = 0x500;
  }
  return;
}

Assistant:

void ReferenceContext::drawElementsInstancedBaseVertex (deUint32 mode, int count, deUint32 type, const void *indices, int instanceCount, int baseVertex)
{
	rc::VertexArray& vao = (m_vertexArrayBinding) ? (*m_vertexArrayBinding) : (m_clientVertexArray);

	// Error conditions
	{
		RC_IF_ERROR(type != GL_UNSIGNED_BYTE &&
					type != GL_UNSIGNED_SHORT &&
					type != GL_UNSIGNED_INT, GL_INVALID_ENUM, RC_RET_VOID);
		RC_IF_ERROR(count < 0 || instanceCount < 0, GL_INVALID_VALUE, RC_RET_VOID);

		if (!predrawErrorChecks(mode))
			return;
	}

	// All is ok
	{
		const rr::PrimitiveType primitiveType	= sglr::rr_util::mapGLPrimitiveType(mode);
		const void*				indicesPtr		= (vao.m_elementArrayBufferBinding) ? (vao.m_elementArrayBufferBinding->getData() + ((const deUint8*)indices - (const deUint8*)DE_NULL)) : (indices);

		drawWithReference(rr::PrimitiveList(primitiveType, count, rr::DrawIndices(indicesPtr, sglr::rr_util::mapGLIndexType(type), baseVertex)), instanceCount);
	}
}